

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

IntervalMap<unsigned_long,_std::monostate,_3U> * __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_3U>::intersection
          (IntervalMap<unsigned_long,_std::monostate,_3U> *__return_storage_ptr__,
          IntervalMap<unsigned_long,_std::monostate,_3U> *this,
          IntervalMap<unsigned_long,_std::monostate,_3U> *other,allocator_type *alloc)

{
  Path *this_00;
  bool bVar1;
  ulong uVar2;
  ulong left;
  ulong uVar3;
  ulong uVar4;
  EVP_PKEY_CTX *ctx;
  const_iterator *pcVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  const_iterator lit;
  const_iterator rend;
  const_iterator rit;
  const_iterator lend;
  const_iterator local_130;
  const_iterator local_f0;
  const_iterator local_b0;
  const_iterator local_70;
  
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->rootSize = 0;
  begin(&local_130,this);
  begin(&local_b0,other);
  end(&local_70,this);
  end(&local_f0,other);
  this_00 = &local_70.path;
  while( true ) {
    ctx = (EVP_PKEY_CTX *)this_00;
    bVar1 = IntervalMapDetails::Path::operator==(&local_130.path,this_00);
    if (bVar1) break;
    ctx = (EVP_PKEY_CTX *)&local_f0.path;
    bVar1 = IntervalMapDetails::Path::operator==(&local_b0.path,(Path *)ctx);
    if (bVar1) break;
    pVar6 = const_iterator::bounds(&local_130);
    uVar3 = pVar6.second;
    uVar2 = pVar6.first;
    pVar6 = const_iterator::bounds(&local_b0);
    uVar4 = pVar6.second;
    left = pVar6.first;
    pcVar5 = &local_130;
    if ((uVar3 < left) || (pcVar5 = &local_b0, uVar4 < uVar2)) {
      const_iterator::operator++(pcVar5);
    }
    else {
      if (left < uVar2) {
        left = uVar2;
      }
      uVar2 = uVar3;
      if (uVar4 < uVar3) {
        uVar2 = uVar4;
      }
      unionWith(__return_storage_ptr__,left,uVar2,
                (monostate *)
                ((long)local_130.path.path.
                       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                       [local_130.path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].node
                + (ulong)local_130.path.path.
                         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                         [local_130.path.path.
                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                         offset + (ulong)((local_130.map)->height != 0) * 0x80 + 0x30),alloc);
      if (uVar3 < uVar4) {
        pcVar5 = &local_130;
      }
      const_iterator::operator++(pcVar5);
    }
  }
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
            ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&local_f0.path,ctx);
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
            ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this_00,ctx);
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
            ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&local_b0.path,ctx);
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
            ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&local_130.path,ctx);
  return __return_storage_ptr__;
}

Assistant:

IntervalMap<TKey, TValue, N> IntervalMap<TKey, TValue, N>::intersection(
    const IntervalMap& other, allocator_type& alloc) const {

    IntervalMap result;
    auto lit = begin(), rit = other.begin();
    auto lend = end(), rend = other.end();
    while (lit != lend && rit != rend) {
        auto lkey = lit.bounds(), rkey = rit.bounds();
        if (lkey.second < rkey.first) {
            ++lit;
        }
        else if (rkey.second < lkey.first) {
            ++rit;
        }
        else {
            // We will arbitrarily take the left hand value,
            // since there's no way to merge them. Presumably if
            // this method is being called the values don't matter.
            auto left = std::max(lkey.first, rkey.first);
            auto right = std::min(lkey.second, rkey.second);
            result.unionWith(left, right, *lit, alloc);

            if (lkey.second < rkey.second)
                ++lit;
            else
                ++rit;
        }
    }
    return result;
}